

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O3

void __thiscall wallet::coinselector_tests::SelectCoins_test::test_method(SelectCoins_test *this)

{
  undefined1 *puVar1;
  long lVar2;
  uint uVar3;
  uint64_t uVar4;
  T *this_00;
  int iVar5;
  int iVar6;
  CAmount *nTargetValue;
  iterator pvVar7;
  CCoinControl *pCVar8;
  iterator pvVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  double dVar13;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar14;
  int in_stack_fffffffffffffb18;
  CAmount local_4d8;
  undefined1 local_4d0 [16];
  undefined1 *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  CAmount target;
  default_random_engine generator;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  __uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> local_448;
  assertion_result local_440;
  __uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> local_428;
  __uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> local_420;
  char *local_418;
  unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> local_410;
  assertion_result local_408;
  undefined1 local_3f0 [16];
  pointer local_3e0;
  pointer local_3d8;
  __uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_> local_3d0;
  pointer puStack_3c8;
  CFeeRate CStack_3c0;
  undefined7 uStack_3b8;
  undefined1 local_3b1;
  undefined7 uStack_3b0;
  undefined8 uStack_3a9;
  __uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_> local_3a0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  undefined **local_388;
  _Invoker_type p_Stack_380;
  __uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
  local_378;
  __uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_> local_370;
  __uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_> local_368;
  __uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_> local_360;
  thread tStack_358;
  Result<wallet::SelectionResult> result;
  CCoinControl cc;
  CoinsResult available_coins;
  FastRandomContext rand;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (undefined1 *)
           ((long)&cc.destChange.
                   super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
           + 0x10);
  cc.destChange.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cc,"");
  NewWallet((NodeContext *)&wallet,
            (string *)
            (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node.chain._M_t.
            super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
            super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
            super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl);
  if ((undefined1 *)
      cc.destChange.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._0_8_ != puVar1) {
    operator_delete((void *)cc.destChange.
                            super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            .
                            super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            .
                            super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            .
                            super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            .
                            super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            .
                            super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            ._M_u._0_8_,
                    cc.destChange.
                    super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    .
                    super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    .
                    super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    .
                    super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    .
                    super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    .
                    super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    ._M_u._16_8_ + 1);
  }
  criticalblock15.super_unique_lock._M_device =
       (mutex_type *)
       ((long)wallet._M_t.
              super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
              super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
              super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl + 0x1e8);
  criticalblock15.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock15.super_unique_lock);
  generator._M_x = 1;
  FastRandomContext::FastRandomContext(&rand,false);
  iVar6 = 0;
  do {
    available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header;
    available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload._M_value = 0;
    available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    available_coins.total_amount = 0;
    available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_engaged = true;
    iVar5 = 1000;
    lVar11 = 0;
    available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      dVar13 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (&generator);
      dVar13 = log(1.0 - dVar13);
      lVar10 = (long)((dVar13 / -100.0) * 10000000.0);
      cc.destChange.
      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      .
      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ._M_u._0_8_ = lVar10;
      add_coin(&available_coins,
               (CWallet *)
               wallet._M_t.
               super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
               super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
               super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&cc,
               (CFeeRate)0x0,0x90,false,0,false,in_stack_fffffffffffffb18);
      lVar11 = lVar11 + lVar10;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    do {
      uVar4 = RandomMixin<FastRandomContext>::randbits((RandomMixin<FastRandomContext> *)&rand,9);
    } while (299 < uVar4);
    uVar12 = lVar11 - 0x3e9;
    if (uVar12 == 0) {
      uVar3 = 0x40;
    }
    else {
      lVar11 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      uVar3 = (uint)lVar11 ^ 0x3f;
    }
    do {
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)&rand,0x40 - uVar3);
    } while (uVar12 < uVar4);
    target = uVar4 + 1000;
    local_3f0._8_8_ = (pointer)0x9400000022;
    local_3e0 = (pointer)0xf4240;
    local_3a0._M_t.super__Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_>.
    super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl =
         (tuple<CScheduler_*,_std::default_delete<CScheduler>_>)
         (_Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_>)0x0;
    uStack_3b0 = 0;
    uStack_3a9 = 0;
    CStack_3c0.nSatoshisPerK = 0;
    uStack_3b8 = 0;
    local_3b1 = 0;
    local_3d0._M_t.
    super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
    super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl =
         (tuple<interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)
         (_Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)0x0;
    puStack_3c8 = (pointer)0x1;
    local_3d8 = (pointer)0x1;
    local_3f0._0_8_ = (ArgsManager *)&rand;
    CCoinControl::CCoinControl(&cc);
    local_388 = (undefined **)0x0;
    p_Stack_380 = (_Invoker_type)0x0;
    local_378._M_t.
    super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
    .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl =
         (tuple<node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>)
         (_Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
          )0x0;
    local_370._M_t.
    super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
    super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl =
         (tuple<ValidationSignals_*,_std::default_delete<ValidationSignals>_>)&p_Stack_380;
    local_360._M_t.super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
    super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl =
         (tuple<node::Warnings_*,_std::default_delete<node::Warnings>_>)
         (_Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>)0x0;
    tStack_358._M_id._M_thread = (id)0;
    nTargetValue = &target;
    pCVar8 = &cc;
    local_368._M_t.
    super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
    super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl =
         local_370._M_t.
         super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
         super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
    SelectCoins(&result,(CWallet *)
                        wallet._M_t.
                        super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>
                        .super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,
                &available_coins,(PreSelectedInputs *)&local_388,nTargetValue,&cc,
                (CoinSelectionParams *)local_3f0);
    std::
    _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                 *)&local_388);
    local_470 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_468 = "";
    local_480 = &boost::unit_test::basic_cstring<char_const>::null;
    local_478 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar14 = 0x7a87bf;
    file.m_end = (iterator)0x365;
    file.m_begin = (iterator)&local_470;
    msg.m_end = (iterator)pCVar8;
    msg.m_begin = (iterator)nTargetValue;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_480,msg);
    local_440.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (result.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index == '\x01');
    local_440.m_message.px = (element_type *)0x0;
    local_440.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_4d0._0_8_ = "result";
    local_4d0._8_8_ = "";
    p_Stack_380 = (_Invoker_type)((ulong)p_Stack_380 & 0xffffffffffffff00);
    local_388 = &PTR__lazy_ostream_01389048;
    local_378._M_t.
    super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
    .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl =
         (tuple<node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>)
         boost::unit_test::lazy_ostream::inst;
    local_370._M_t.
    super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
    super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl =
         (tuple<ValidationSignals_*,_std::default_delete<ValidationSignals>_>)local_4d0;
    local_490 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_488 = "";
    pvVar7 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_440,(lazy_ostream *)&local_388,1,0,WARN,_cVar14,(size_t)&local_490,0x365);
    boost::detail::shared_count::~shared_count(&local_440.m_message.pn);
    local_4a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_498 = "";
    local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x366;
    file_00.m_begin = (iterator)&local_4a0;
    msg_00.m_end = pvVar9;
    msg_00.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4b0,
               msg_00);
    local_4d0._8_8_ = local_4d0._8_8_ & 0xffffffffffffff00;
    local_4d0._0_8_ = &PTR__lazy_ostream_01388f08;
    local_4c0 = boost::unit_test::lazy_ostream::inst;
    local_4b8 = "";
    this_00 = util::Result<wallet::SelectionResult>::value(&result);
    local_4d8 = SelectionResult::GetSelectedValue(this_00);
    local_408.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(target <= local_4d8);
    local_408.m_message.px = (element_type *)0x0;
    local_408.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_418 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_410._M_t.
    super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>._M_t.
    super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
    super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
         (__uniq_ptr_data<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>,_true,_true>
          )((long)
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
           + 0x72);
    local_420._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
         (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)&local_4d8;
    p_Stack_380 = (_Invoker_type)((ulong)p_Stack_380 & 0xffffffffffffff00);
    local_388 = &PTR__lazy_ostream_013892a8;
    local_378._M_t.
    super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
    .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl =
         (tuple<node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>)
         boost::unit_test::lazy_ostream::inst;
    local_370._M_t.
    super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
    super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl =
         (tuple<ValidationSignals_*,_std::default_delete<ValidationSignals>_>)&local_420;
    local_448._M_t.super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
    super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl =
         (tuple<ECC_Context_*,_std::default_delete<ECC_Context>_>)&target;
    local_440.m_message.px = (element_type *)((ulong)local_440.m_message.px & 0xffffffffffffff00);
    local_440._0_8_ = &PTR__lazy_ostream_013892a8;
    local_440.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_428._M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
    super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
         (tuple<CConnman_*,_std::default_delete<CConnman>_>)&local_448;
    boost::test_tools::tt_detail::report_assertion
              (&local_408,(lazy_ostream *)local_4d0,1,7,REQUIRE,0xf5ed7f,(size_t)&local_418,0x366,
               (PreSelectedInputs *)&local_388,"target",&local_440);
    boost::detail::shared_count::~shared_count(&local_408.m_message.pn);
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)&result);
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
    ::~_Rb_tree(&cc.m_selected._M_t);
    std::
    _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
    ::~_Rb_tree(&cc.m_external_provider.tr_trees._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&cc.m_external_provider.keys._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
    ::~_Rb_tree(&cc.m_external_provider.origins._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::~_Rb_tree(&cc.m_external_provider.pubkeys._M_t);
    std::
    _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::~_Rb_tree(&cc.m_external_provider.scripts._M_t);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&cc);
    std::
    _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                 *)&available_coins);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 100);
  ChaCha20::~ChaCha20(&rand.rng);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock15.super_unique_lock);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&wallet);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(SelectCoins_test)
{
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);
    LOCK(wallet->cs_wallet); // Every 'SelectCoins' call requires it

    // Random generator stuff
    std::default_random_engine generator;
    std::exponential_distribution<double> distribution (100);
    FastRandomContext rand;

    // Run this test 100 times
    for (int i = 0; i < 100; ++i)
    {
        CoinsResult available_coins;
        CAmount balance{0};

        // Make a wallet with 1000 exponentially distributed random inputs
        for (int j = 0; j < 1000; ++j)
        {
            CAmount val = distribution(generator)*10000000;
            add_coin(available_coins, *wallet, val);
            balance += val;
        }

        // Generate a random fee rate in the range of 100 - 400
        CFeeRate rate(rand.randrange(300) + 100);

        // Generate a random target value between 1000 and wallet balance
        CAmount target = rand.randrange(balance - 1000) + 1000;

        // Perform selection
        CoinSelectionParams cs_params{
            rand,
            /*change_output_size=*/ 34,
            /*change_spend_size=*/ 148,
            /*min_change_target=*/ CENT,
            /*effective_feerate=*/ CFeeRate(0),
            /*long_term_feerate=*/ CFeeRate(0),
            /*discard_feerate=*/ CFeeRate(0),
            /*tx_noinputs_size=*/ 0,
            /*avoid_partial=*/ false,
        };
        cs_params.m_cost_of_change = 1;
        cs_params.min_viable_change = 1;
        CCoinControl cc;
        const auto result = SelectCoins(*wallet, available_coins, /*pre_set_inputs=*/{}, target, cc, cs_params);
        BOOST_CHECK(result);
        BOOST_CHECK_GE(result->GetSelectedValue(), target);
    }
}